

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-coroutine-test.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::_::
NullableValue<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++:520:10)>
::
anon_union_8_1_a8c68091_for_NullableValue<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++:520:10)>_2
::anon_class_8_1_54a39809_for_value::operator()
          (anon_class_8_1_54a39809_for_value *this,Timer *timer)

{
  Coroutine<unsigned_long> *this_00;
  Promise<void> *promise;
  PromiseAwaiter<void> *__return_storage_ptr__;
  PromiseArenaMember *node;
  SourceLocation location;
  bool bVar1;
  coroutine_handle<void> coroutine;
  long *in_RDX;
  
  coroutine._M_fr_ptr = operator_new(0x418);
  *(code **)coroutine._M_fr_ptr = operator();
  *(code **)((long)coroutine._M_fr_ptr + 8) = operator();
  this_00 = (Coroutine<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x10);
  *(Timer **)((long)coroutine._M_fr_ptr + 0x408) = timer;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006094f8;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_00609540;
  location.function = "operator()";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++"
  ;
  location.lineNumber = 0x208;
  location.columnNumber = 10;
  CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  promise = (Promise<void> *)((long)coroutine._M_fr_ptr + 0x400);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006094f8;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_00609540;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  this->i = (size_t)this_00;
  (**(code **)(*in_RDX + 0x10))(promise);
  __return_storage_ptr__ = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x240);
  co_await<void>(__return_storage_ptr__,promise);
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x410) = 0;
  bVar1 = PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (!bVar1) {
    PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
    if (*(char *)((long)coroutine._M_fr_ptr + 600) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x260));
    }
    PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
    node = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
    if (node != (PromiseArenaMember *)0x0) {
      (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
      PromiseDisposer::dispose(node);
    }
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x3f8) =
         **(undefined8 **)((long)coroutine._M_fr_ptr + 0x408);
    Coroutine<unsigned_long>::fulfill
              (this_00,(FixVoid<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x3f8));
    *(undefined8 *)coroutine._M_fr_ptr = 0;
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x410) = 1;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

auto makeDelayedIntegerFunctor(size_t i) {
  return [i](kj::Timer& timer) -> kj::Promise<size_t> {
    co_await timer.afterDelay(1 * kj::MILLISECONDS);
    co_return i;
  };
}